

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  art_val_t *paVar2;
  int iVar3;
  container_t *pcVar4;
  leaf_t *val;
  byte type2;
  uint8_t typecode2;
  byte local_149 [9];
  art_iterator_t it1;
  art_iterator_t it2;
  
  if (r1 != r2) {
    art_init_iterator(&it1,&r1->art,true);
    art_init_iterator(&it2,&r2->art,true);
LAB_00105d7f:
    while (paVar2 = it2.value, it1.value != (art_val_t *)0x0 || it2.value != (art_val_t *)0x0) {
      if (it1.value != (art_val_t *)0x0 && it2.value != (art_val_t *)0x0) {
        iVar3 = art_compare_keys(it1.key,it2.key);
        paVar1 = it1.value;
        if (iVar3 != 0) {
          if (paVar2 == (art_val_t *)0x0 || iVar3 < 0) goto LAB_00105de0;
          goto LAB_00105e63;
        }
        local_149[0] = it1.value[1].key[0];
        pcVar4 = *(container_t **)(it2.value[1].key + 2);
        type2 = it2.value[1].key[0];
        if (local_149[0] != 4) {
          get_writable_copy_if_shared(*(container_t **)(it1.value[1].key + 2),local_149);
          if (type2 == 4) {
            type2 = *(byte *)((long)pcVar4 + 8);
          }
          local_149[1] = 0;
          local_149[2] = 0;
          local_149[3] = 0;
          local_149[4] = 0;
          local_149[5] = 0;
          local_149[6] = 0;
          local_149[7] = 0;
          local_149[8] = 0;
          (*(code *)(&DAT_00126530 +
                    *(int *)(&DAT_00126530 + (ulong)(((uint)type2 + (uint)local_149[0] * 4) - 5) * 4
                            )))();
          return;
        }
        pcVar4 = container_or(*(container_t **)(it1.value[1].key + 2),'\x04',pcVar4,type2,&typecode2
                             );
        if (pcVar4 != *(container_t **)(paVar1[1].key + 2)) {
          container_free(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0]);
          *(container_t **)(paVar1[1].key + 2) = pcVar4;
          paVar1[1].key[0] = typecode2;
        }
        art_iterator_next(&it1);
        goto LAB_00105e7c;
      }
      if (it1.value == (art_val_t *)0x0) goto LAB_00105e5a;
      if (it2.value == (art_val_t *)0x0) {
LAB_00105de0:
        art_iterator_next(&it1);
      }
    }
  }
  return;
LAB_00105e5a:
  if (it2.value != (art_val_t *)0x0) {
LAB_00105e63:
    val = copy_leaf_container((leaf_t *)it2.value);
    art_iterator_insert(&r1->art,&it1,it2.key,&val->_pad);
LAB_00105e7c:
    art_iterator_next(&it2);
  }
  goto LAB_00105d7f;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(leaf1->container, leaf1->typecode,
                                              leaf2->container, leaf2->typecode,
                                              &typecode2);
                } else {
                    container2 = container_ior(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != leaf1->container) {
                    container_free(leaf1->container, leaf1->typecode);
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_iterator_insert(&r1->art, &it1, it2.key,
                                (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
}